

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O2

BtorSimBitVector * btorsim_bv_eq(BtorSimBitVector *a,BtorSimBitVector *b)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  BtorSimBitVector *bv;
  ulong uVar3;
  uint32_t bit;
  
  bit = 1;
  bv = btorsim_bv_new(1);
  uVar3 = 0;
  do {
    if (a->len == uVar3) goto LAB_00115836;
    puVar1 = &a[1].width + uVar3;
    puVar2 = &b[1].width + uVar3;
    uVar3 = uVar3 + 1;
  } while (*puVar1 == *puVar2);
  bit = 0;
LAB_00115836:
  btorsim_bv_set_bit(bv,0,bit);
  return bv;
}

Assistant:

BtorSimBitVector *
btorsim_bv_eq (const BtorSimBitVector *a, const BtorSimBitVector *b)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  uint32_t i, bit;
  BtorSimBitVector *res;

  res = btorsim_bv_new (1);
  bit = 1;
  for (i = 0; i < a->len; i++)
  {
    if (a->bits[i] != b->bits[i])
    {
      bit = 0;
      break;
    }
  }
  btorsim_bv_set_bit (res, 0, bit);

  assert (rem_bits_zero_dbg (res));
  return res;
}